

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

char * ox_stack_popfront(stack_s *self)

{
  char *pcVar1;
  
  if (self->num < 1) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = ox_array_at(self->array,self->front);
  }
  if (pcVar1 != (char *)0x0) {
    self->num = self->num + -1;
    self->front = (self->front + 1) % self->element_num;
  }
  return pcVar1;
}

Assistant:

char*
ox_stack_popfront(struct stack_s* self)
{
    char* ret = ox_stack_front(self);

    if(ret != NULL)
    {
        self->num--;
        self->front++;
        self->front %= self->element_num;
    }

    return ret;
}